

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void doctest::anon_unknown_14::anon_unknown_35::hexEscapeChar(ostream *os,uchar c)

{
  _func_int *p_Var1;
  undefined4 uVar2;
  _func_int **pp_Var3;
  code cVar4;
  
  uVar2 = *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]);
  std::__ostream_insert<char,std::char_traits<char>>(os,"\\x",2);
  pp_Var3 = os->_vptr_basic_ostream;
  *(uint *)(&os->field_0x18 + (long)pp_Var3[-3]) =
       *(uint *)(&os->field_0x18 + (long)pp_Var3[-3]) | 0x4000;
  *(uint *)(&os->field_0x18 + (long)pp_Var3[-3]) =
       *(uint *)(&os->field_0x18 + (long)pp_Var3[-3]) & 0xffffffb5 | 8;
  p_Var1 = (_func_int *)((long)&os->_vptr_basic_ostream + (long)pp_Var3[-3]);
  if ((&os->field_0xe1)[(long)pp_Var3[-3]] == '\0') {
    cVar4 = (code)std::ios::widen((char)p_Var1);
    p_Var1[0xe0] = cVar4;
    p_Var1[0xe1] = (code)0x1;
  }
  p_Var1[0xe0] = (code)0x30;
  *(undefined8 *)(&os->field_0x10 + (long)os->_vptr_basic_ostream[-3]) = 2;
  std::ostream::operator<<(os,(uint)c);
  *(undefined4 *)(&os->field_0x18 + (long)os->_vptr_basic_ostream[-3]) = uVar2;
  return;
}

Assistant:

void hexEscapeChar(std::ostream& os, unsigned char c) {
        std::ios_base::fmtflags f(os.flags());
        os << "\\x"
            << std::uppercase << std::hex << std::setfill('0') << std::setw(2)
            << static_cast<int>(c);
        os.flags(f);
    }